

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

void __thiscall
slang::ast::SequenceRange::serializeTo(SequenceRange *this,ASTSerializer *serializer)

{
  ASTSerializer::write(serializer,3,"min",(ulong)this->min);
  if ((this->max).super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged == true) {
    ASTSerializer::write
              (serializer,3,"max",
               (ulong)(this->max).super__Optional_base<unsigned_int,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_int>._M_payload._M_value);
    return;
  }
  ASTSerializer::write(serializer,3,"max",1);
  return;
}

Assistant:

void SequenceRange::serializeTo(ASTSerializer& serializer) const {
    serializer.write("min", min);
    if (max)
        serializer.write("max", *max);
    else
        serializer.write("max", "$"sv);
}